

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

int __thiscall
ot::commissioner::UdpSocket::Bind(UdpSocket *this,string *aLocalAddr,uint16_t aLocalPort)

{
  event *ev;
  undefined1 *ctx;
  int iVar1;
  undefined6 in_register_00000012;
  uint __len;
  string portStr;
  char *local_50 [2];
  char local_40 [16];
  
  __len = 1;
  if ((9 < aLocalPort) && (__len = 2, 99 < aLocalPort)) {
    __len = 3;
    if (999 < aLocalPort) {
      __len = 5 - (aLocalPort < 10000);
    }
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50[0],__len,(uint)CONCAT62(in_register_00000012,aLocalPort));
  ctx = &(this->super_Socket).field_0xb4;
  mbedtls_net_free((mbedtls_net_context *)ctx);
  ev = &(this->super_Socket).mEvent;
  if ((this->super_Socket).mEvent.ev_base != (event_base *)0x0) {
    event_del(ev);
  }
  iVar1 = mbedtls_net_bind((mbedtls_net_context *)ctx,(aLocalAddr->_M_dataplus)._M_p,local_50[0],1);
  if (iVar1 == 0) {
    iVar1 = mbedtls_net_set_nonblock((mbedtls_net_context *)ctx);
    if (iVar1 == 0) {
      iVar1 = event_assign(ev,(this->super_Socket).mEventBase,
                           *(int *)&(this->super_Socket).field_0xb4,0x36,Socket::HandleEvent,this);
      if (iVar1 == 0) {
        iVar1 = event_add(ev,(timeval *)0x0);
        if (iVar1 == 0) {
          this->mIsBound = true;
          iVar1 = 0;
          goto LAB_001c1405;
        }
      }
    }
  }
  mbedtls_net_free((mbedtls_net_context *)ctx);
LAB_001c1405:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return iVar1;
}

Assistant:

int UdpSocket::Bind(const std::string &aLocalAddr, uint16_t aLocalPort)
{
    auto portStr = std::to_string(aLocalPort);

    // Free the fd if already opened.
    mbedtls_net_free(&mNetCtx);
    if (mEvent.ev_base != nullptr)
    {
        event_del(&mEvent);
    }

    // Bind
    int rval = mbedtls_net_bind(&mNetCtx, aLocalAddr.c_str(), portStr.c_str(), MBEDTLS_NET_PROTO_UDP);
    VerifyOrExit(rval == 0);
    VerifyOrExit((rval = mbedtls_net_set_nonblock(&mNetCtx)) == 0);

    // Setup Event
    rval = event_assign(&mEvent, mEventBase, mNetCtx.fd, EV_PERSIST | EV_READ | EV_WRITE | EV_ET, HandleEvent, this);
    VerifyOrExit(rval == 0);
    VerifyOrExit((rval = event_add(&mEvent, nullptr)) == 0);

exit:
    if (rval != 0)
    {
        mbedtls_net_free(&mNetCtx);
    }
    else
    {
        mIsBound = true;
    }
    return rval;
}